

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O0

pageant_pubkey * find_key(char *string,char **retstr)

{
  _Bool _Var1;
  int iVar2;
  char *pcVar3;
  bool local_a9;
  uint local_9c;
  char *pcStack_98;
  uint i;
  char *error_1;
  char *error;
  Filename *pFStack_80;
  int keytype;
  Filename *fn;
  byte local_6d;
  FingerprintType fptype;
  _Bool try_all_fptypes;
  _Bool file_errors;
  _Bool try_comment;
  _Bool try_fp;
  pageant_pubkey *ppStack_68;
  _Bool try_file;
  pageant_pubkey *key_ret;
  pageant_pubkey key_in;
  key_find_ctx ctx [1];
  char **retstr_local;
  char *string_local;
  
  fptype._3_1_ = 1;
  fptype._2_1_ = 1;
  fptype._1_1_ = 1;
  fptype._0_1_ = SSH_FPTYPE_MD5;
  local_6d = 1;
  fn._4_4_ = 1;
  iVar2 = strncmp(string,"file:",5);
  if (iVar2 == 0) {
    retstr_local = (char **)(string + 5);
    fptype._2_1_ = SSH_FPTYPE_MD5 >> 0x10;
    fptype._1_1_ = SSH_FPTYPE_MD5 >> 8;
    fptype._0_1_ = SSH_FPTYPE_SHA256;
  }
  else {
    iVar2 = strncmp(string,"comment:",8);
    if (iVar2 == 0) {
      retstr_local = (char **)(string + 8);
      fptype._3_1_ = SSH_FPTYPE_MD5 >> 0x18;
      fptype._2_1_ = SSH_FPTYPE_MD5 >> 0x10;
    }
    else {
      iVar2 = strncmp(string,"fp:",3);
      if (iVar2 == 0) {
        retstr_local = (char **)(string + 3);
        fptype._3_1_ = SSH_FPTYPE_MD5 >> 0x18;
        fptype._1_1_ = SSH_FPTYPE_MD5 >> 8;
      }
      else {
        iVar2 = strncmp(string,"fingerprint:",0xc);
        if (iVar2 == 0) {
          retstr_local = (char **)(string + 0xc);
          fptype._3_1_ = SSH_FPTYPE_MD5 >> 0x18;
          fptype._1_1_ = SSH_FPTYPE_MD5 >> 8;
        }
        else {
          iVar2 = strncasecmp(string,"md5:",4);
          if (iVar2 == 0) {
            retstr_local = (char **)(string + 4);
            fptype._3_1_ = SSH_FPTYPE_MD5 >> 0x18;
            fptype._1_1_ = SSH_FPTYPE_MD5 >> 8;
            local_6d = 0;
            fn._4_4_ = 0;
          }
          else {
            iVar2 = strncmp(string,"sha256:",7);
            retstr_local = (char **)string;
            if (iVar2 == 0) {
              retstr_local = (char **)(string + 7);
              fptype._3_1_ = SSH_FPTYPE_MD5 >> 0x18;
              fptype._1_1_ = SSH_FPTYPE_MD5 >> 8;
              local_6d = 0;
              fn._4_4_ = 1;
            }
          }
        }
      }
    }
  }
  if ((fptype._3_1_ & 1) != SSH_FPTYPE_MD5 >> 0x18) {
    pFStack_80 = filename_from_str((char *)retstr_local);
    error._4_4_ = key_type(pFStack_80);
    if ((error._4_4_ == 2) || (error._4_4_ == 8)) {
      key_ret = (pageant_pubkey *)strbuf_new();
      iVar2 = rsa1_loadpub_f(pFStack_80,((strbuf *)key_ret)->binarysink_,(char **)0x0,&error_1);
      if (iVar2 != 0) {
        key_in.comment._0_4_ = 1;
        key_in.blob = (strbuf *)0x0;
        ppStack_68 = pageant_pubkey_copy((pageant_pubkey *)&key_ret);
        strbuf_free((strbuf *)key_ret);
        key_ret = (pageant_pubkey *)0x0;
        filename_free(pFStack_80);
        return ppStack_68;
      }
      strbuf_free((strbuf *)key_ret);
      key_ret = (pageant_pubkey *)0x0;
      if (((undefined1)fptype & SSH_FPTYPE_SHA256) != SSH_FPTYPE_MD5) {
        pcVar3 = dupprintf("unable to load file \'%s\': %s",retstr_local,error_1);
        *retstr = pcVar3;
        filename_free(pFStack_80);
        return (pageant_pubkey *)0x0;
      }
    }
    else if (((error._4_4_ == 3) || (error._4_4_ == 9)) || (error._4_4_ == 10)) {
      key_ret = (pageant_pubkey *)strbuf_new();
      _Var1 = ppk_loadpub_f(pFStack_80,(char **)0x0,((strbuf *)key_ret)->binarysink_,(char **)0x0,
                            &stack0xffffffffffffff68);
      if (_Var1) {
        key_in.comment._0_4_ = 2;
        key_in.blob = (strbuf *)0x0;
        ppStack_68 = pageant_pubkey_copy((pageant_pubkey *)&key_ret);
        strbuf_free((strbuf *)key_ret);
        key_ret = (pageant_pubkey *)0x0;
        filename_free(pFStack_80);
        return ppStack_68;
      }
      strbuf_free((strbuf *)key_ret);
      key_ret = (pageant_pubkey *)0x0;
      if (((undefined1)fptype & SSH_FPTYPE_SHA256) != SSH_FPTYPE_MD5) {
        pcVar3 = dupprintf("unable to load file \'%s\': %s",retstr_local,pcStack_98);
        *retstr = pcVar3;
        filename_free(pFStack_80);
        return (pageant_pubkey *)0x0;
      }
    }
    else if (((undefined1)fptype & SSH_FPTYPE_SHA256) != SSH_FPTYPE_MD5) {
      pcVar3 = key_type_to_str(error._4_4_);
      pcVar3 = dupprintf("unable to load key file \'%s\': %s",retstr_local,pcVar3);
      *retstr = pcVar3;
      filename_free(pFStack_80);
      return (pageant_pubkey *)0x0;
    }
    filename_free(pFStack_80);
  }
  key_in._16_8_ = retstr_local;
  ctx[0].string._0_1_ = fptype._2_1_ & 1;
  ctx[0].string._1_1_ = fptype._1_1_ & 1;
  for (local_9c = 0; local_9c < 2; local_9c = local_9c + 1) {
    local_a9 = (local_6d & 1) != 0 || local_9c == fn._4_4_;
    ctx[0].match_fptypes[(ulong)local_9c - 8] = local_a9;
  }
  ctx[0].match_fp = false;
  ctx[0].match_comment = false;
  ctx[0].match_fptypes[0] = false;
  ctx[0].match_fptypes[1] = false;
  ctx[0]._12_4_ = 0;
  ctx[0].found._0_4_ = 0;
  iVar2 = pageant_enum_keys(key_find_callback,&key_in.ssh_version,retstr);
  if (iVar2 == 1) {
    string_local = (char *)0x0;
  }
  else if ((int)ctx[0].found == 0) {
    pcVar3 = dupstr("no key matched");
    *retstr = pcVar3;
    if (ctx[0]._8_8_ != 0) {
      __assert_fail("!ctx->found",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/pageant.c"
                    ,0x32b,"struct pageant_pubkey *find_key(const char *, char **)");
    }
    string_local = (char *)0x0;
  }
  else if ((int)ctx[0].found < 2) {
    if (ctx[0]._8_8_ == 0) {
      __assert_fail("ctx->found",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/pageant.c"
                    ,0x334,"struct pageant_pubkey *find_key(const char *, char **)");
    }
    string_local = (char *)ctx[0]._8_8_;
  }
  else {
    pcVar3 = dupstr("multiple keys matched");
    *retstr = pcVar3;
    if (ctx[0]._8_8_ == 0) {
      __assert_fail("ctx->found",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/pageant.c"
                    ,0x32f,"struct pageant_pubkey *find_key(const char *, char **)");
    }
    pageant_pubkey_free((pageant_pubkey *)ctx[0]._8_8_);
    string_local = (char *)0x0;
  }
  return (pageant_pubkey *)string_local;
}

Assistant:

struct pageant_pubkey *find_key(const char *string, char **retstr)
{
    struct key_find_ctx ctx[1];
    struct pageant_pubkey key_in, *key_ret;
    bool try_file = true, try_fp = true, try_comment = true;
    bool file_errors = false;
    bool try_all_fptypes = true;
    FingerprintType fptype = SSH_FPTYPE_DEFAULT;

    /*
     * Trim off disambiguating prefixes telling us how to interpret
     * the provided string.
     */
    if (!strncmp(string, "file:", 5)) {
        string += 5;
        try_fp = false;
        try_comment = false;
        file_errors = true; /* also report failure to load the file */
    } else if (!strncmp(string, "comment:", 8)) {
        string += 8;
        try_file = false;
        try_fp = false;
    } else if (!strncmp(string, "fp:", 3)) {
        string += 3;
        try_file = false;
        try_comment = false;
    } else if (!strncmp(string, "fingerprint:", 12)) {
        string += 12;
        try_file = false;
        try_comment = false;
    } else if (!strnicmp(string, "md5:", 4)) {
        string += 4;
        try_file = false;
        try_comment = false;
        try_all_fptypes = false;
        fptype = SSH_FPTYPE_MD5;
    } else if (!strncmp(string, "sha256:", 7)) {
        string += 7;
        try_file = false;
        try_comment = false;
        try_all_fptypes = false;
        fptype = SSH_FPTYPE_SHA256;
    }

    /*
     * Try interpreting the string as a key file name.
     */
    if (try_file) {
        Filename *fn = filename_from_str(string);
        int keytype = key_type(fn);
        if (keytype == SSH_KEYTYPE_SSH1 ||
            keytype == SSH_KEYTYPE_SSH1_PUBLIC) {
            const char *error;

            key_in.blob = strbuf_new();
            if (!rsa1_loadpub_f(fn, BinarySink_UPCAST(key_in.blob),
                                NULL, &error)) {
                strbuf_free(key_in.blob);
                key_in.blob = NULL;
                if (file_errors) {
                    *retstr = dupprintf("unable to load file '%s': %s",
                                        string, error);
                    filename_free(fn);
                    return NULL;
                }
            } else {
                /*
                 * If we've successfully loaded the file, stop here - we
                 * already have a key blob and need not go to the agent to
                 * list things.
                 */
                key_in.ssh_version = 1;
                key_in.comment = NULL;
                key_ret = pageant_pubkey_copy(&key_in);
                strbuf_free(key_in.blob);
                key_in.blob = NULL;
                filename_free(fn);
                return key_ret;
            }
        } else if (keytype == SSH_KEYTYPE_SSH2 ||
                   keytype == SSH_KEYTYPE_SSH2_PUBLIC_RFC4716 ||
                   keytype == SSH_KEYTYPE_SSH2_PUBLIC_OPENSSH) {
            const char *error;

            key_in.blob = strbuf_new();
            if (!ppk_loadpub_f(fn, NULL, BinarySink_UPCAST(key_in.blob),
                               NULL, &error)) {
                strbuf_free(key_in.blob);
                key_in.blob = NULL;
                if (file_errors) {
                    *retstr = dupprintf("unable to load file '%s': %s",
                                        string, error);
                    filename_free(fn);
                    return NULL;
                }
            } else {
                /*
                 * If we've successfully loaded the file, stop here - we
                 * already have a key blob and need not go to the agent to
                 * list things.
                 */
                key_in.ssh_version = 2;
                key_in.comment = NULL;
                key_ret = pageant_pubkey_copy(&key_in);
                strbuf_free(key_in.blob);
                key_in.blob = NULL;
                filename_free(fn);
                return key_ret;
            }
        } else {
            if (file_errors) {
                *retstr = dupprintf("unable to load key file '%s': %s",
                                    string, key_type_to_str(keytype));
                filename_free(fn);
                return NULL;
            }
        }
        filename_free(fn);
    }

    /*
     * Failing that, go through the keys in the agent, and match
     * against fingerprints and comments as appropriate.
     */
    ctx->string = string;
    ctx->match_fp = try_fp;
    ctx->match_comment = try_comment;
    for (unsigned i = 0; i < SSH_N_FPTYPES; i++)
        ctx->match_fptypes[i] = (try_all_fptypes || i == fptype);
    ctx->found = NULL;
    ctx->nfound = 0;
    if (pageant_enum_keys(key_find_callback, ctx, retstr) ==
        PAGEANT_ACTION_FAILURE)
        return NULL;

    if (ctx->nfound == 0) {
        *retstr = dupstr("no key matched");
        assert(!ctx->found);
        return NULL;
    } else if (ctx->nfound > 1) {
        *retstr = dupstr("multiple keys matched");
        assert(ctx->found);
        pageant_pubkey_free(ctx->found);
        return NULL;
    }

    assert(ctx->found);
    return ctx->found;
}